

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O2

void __thiscall
wasm::InsertOrderedMap<wasm::Type,_unsigned_int>::InsertOrderedMap
          (InsertOrderedMap<wasm::Type,_unsigned_int> *this,
          InsertOrderedMap<wasm::Type,_unsigned_int> *other)

{
  _List_node_base *p_Var1;
  undefined1 auStack_48 [8];
  pair<const_wasm::Type,_unsigned_int> kv;
  
  (this->Map)._M_h._M_buckets = &(this->Map)._M_h._M_single_bucket;
  (this->Map)._M_h._M_bucket_count = 1;
  (this->Map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Map)._M_h._M_element_count = 0;
  (this->Map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->List).
  super__List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->List;
  (this->List).
  super__List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->List;
  (this->List).
  super__List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
  ._M_impl._M_node._M_size = 0;
  p_Var1 = (_List_node_base *)&other->List;
  while (p_Var1 = (((_List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&other->List) {
    auStack_48 = (undefined1  [8])p_Var1[1]._M_next;
    kv.first.id = (uintptr_t)p_Var1[1]._M_prev;
    insert(this,(pair<const_wasm::Type,_unsigned_int> *)auStack_48);
  }
  return;
}

Assistant:

InsertOrderedMap(const InsertOrderedMap& other) {
    for (auto kv : other) {
      insert(kv);
    }
  }